

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlChar * xmlCatalogListXMLResolveURI(xmlCatalogEntryPtr catal,xmlChar *URI)

{
  xmlGenericErrorFunc p_Var1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  uint len;
  int iVar5;
  int iVar6;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  _xmlCatalogEntry *p_Var11;
  _xmlCatalogEntry *catal_00;
  _xmlCatalogEntry *catal_01;
  ulong uVar12;
  ulong uVar13;
  _xmlCatalogEntry *local_1d8;
  undefined8 auStack_1c8 [51];
  
  if (catal != (xmlCatalogEntryPtr)0x0) {
    iVar4 = xmlStrncmp(URI,(xmlChar *)"urn:publicid:",0xd);
    if (iVar4 == 0) {
      pxVar9 = xmlCatalogUnWrapURN(URI);
      if (xmlDebugCatalogs != 0) {
        pp_Var7 = __xmlGenericError();
        p_Var1 = *pp_Var7;
        ppvVar8 = __xmlGenericErrorContext();
        if (pxVar9 == (xmlChar *)0x0) {
          pcVar3 = "Public URN ID %s expanded to NULL\n";
        }
        else {
          pcVar3 = "Public URN ID expanded to %s\n";
          URI = pxVar9;
        }
        (*p_Var1)(*ppvVar8,pcVar3 + 7,URI);
      }
      pxVar10 = xmlCatalogListXMLResolve(catal,pxVar9,(xmlChar *)0x0);
      if (pxVar9 == (xmlChar *)0x0) {
        return pxVar10;
      }
      (*xmlFree)(pxVar9);
      return pxVar10;
    }
    do {
      if (catal->type == XML_CATA_CATALOG) {
        if (catal->children == (_xmlCatalogEntry *)0x0) {
          xmlFetchXMLCatalogFile(catal);
        }
        catal_01 = catal->children;
        if (catal_01 != (_xmlCatalogEntry *)0x0) {
          if (catal_01->depth < 0x33) {
            uVar2 = 0;
            local_1d8 = (_xmlCatalogEntry *)0x0;
            iVar6 = 0;
            iVar4 = 0;
            p_Var11 = catal_01;
            do {
              switch(p_Var11->type) {
              case XML_CATA_NEXT_CATALOG:
                iVar6 = iVar6 + 1;
                break;
              case XML_CATA_URI:
                iVar5 = xmlStrEqual(URI,p_Var11->name);
                if (iVar5 != 0) {
                  if (xmlDebugCatalogs != 0) {
                    pp_Var7 = __xmlGenericError();
                    p_Var1 = *pp_Var7;
                    ppvVar8 = __xmlGenericErrorContext();
                    (*p_Var1)(*ppvVar8,"Found URI match %s\n",p_Var11->name);
                  }
                  pxVar9 = xmlStrdup(p_Var11->URL);
                  goto LAB_0013adfb;
                }
                break;
              case XML_CATA_REWRITE_URI:
                len = xmlStrlen(p_Var11->name);
                if (((int)uVar2 < (int)len) &&
                   (iVar5 = xmlStrncmp(URI,p_Var11->name,len), iVar5 == 0)) {
                  local_1d8 = p_Var11;
                  uVar2 = len;
                }
                break;
              case XML_CATA_DELEGATE_URI:
                pxVar9 = p_Var11->name;
                iVar5 = xmlStrlen(pxVar9);
                iVar5 = xmlStrncmp(URI,pxVar9,iVar5);
                iVar4 = iVar4 + (uint)(iVar5 == 0);
              }
              p_Var11 = p_Var11->next;
            } while (p_Var11 != (_xmlCatalogEntry *)0x0);
            if (local_1d8 == (_xmlCatalogEntry *)0x0) {
              if (iVar4 == 0) {
                if (iVar6 == 0) goto LAB_0013ab60;
                do {
                  if (catal_01->type == XML_CATA_NEXT_CATALOG) {
                    if (catal_01->children == (_xmlCatalogEntry *)0x0) {
                      xmlFetchXMLCatalogFile(catal_01);
                    }
                    if ((catal_01->children != (xmlCatalogEntryPtr)0x0) &&
                       (pxVar9 = xmlCatalogListXMLResolveURI(catal_01->children,URI),
                       pxVar9 != (xmlChar *)0x0)) break;
                  }
                  catal_01 = catal_01->next;
                  pxVar9 = (xmlChar *)0x0;
                } while (catal_01 != (_xmlCatalogEntry *)0x0);
              }
              else {
                uVar13 = 0;
                do {
                  iVar4 = (int)uVar13;
                  p_Var11 = catal_01;
                  while( true ) {
                    if ((p_Var11->type != XML_CATA_DELEGATE_URI) &&
                       (p_Var11->type != XML_CATA_DELEGATE_SYSTEM)) goto LAB_0013ada4;
                    pxVar9 = p_Var11->name;
                    iVar6 = xmlStrlen(pxVar9);
                    iVar6 = xmlStrncmp(URI,pxVar9,iVar6);
                    if (iVar6 != 0) goto LAB_0013ada4;
                    catal_00 = catal_01;
                    if (iVar4 < 1) break;
                    uVar12 = 0;
                    while (iVar6 = xmlStrEqual(p_Var11->URL,(xmlChar *)auStack_1c8[uVar12]),
                          iVar6 == 0) {
                      uVar12 = uVar12 + 1;
                      catal_00 = p_Var11;
                      if (uVar13 == uVar12) goto LAB_0013ad35;
                    }
                    p_Var11 = p_Var11->next;
                    if (p_Var11 == (_xmlCatalogEntry *)0x0) goto LAB_0013adef;
                  }
LAB_0013ad35:
                  if (iVar4 < 0x32) {
                    uVar13 = (ulong)(iVar4 + 1);
                    auStack_1c8[iVar4] = catal_00->URL;
                  }
                  if (catal_00->children == (_xmlCatalogEntry *)0x0) {
                    xmlFetchXMLCatalogFile(catal_00);
                  }
                  p_Var11 = catal_00;
                  if (catal_00->children != (_xmlCatalogEntry *)0x0) {
                    if (xmlDebugCatalogs != 0) {
                      pp_Var7 = __xmlGenericError();
                      p_Var1 = *pp_Var7;
                      ppvVar8 = __xmlGenericErrorContext();
                      (*p_Var1)(*ppvVar8,"Trying URI delegate %s\n",catal_00->URL);
                    }
                    pxVar9 = xmlCatalogListXMLResolveURI(catal_00->children,URI);
                    if (pxVar9 != (xmlChar *)0x0) goto LAB_0013adfb;
                  }
LAB_0013ada4:
                  catal_01 = p_Var11->next;
                } while (catal_01 != (_xmlCatalogEntry *)0x0);
LAB_0013adef:
                pxVar9 = (xmlChar *)0xffffffffffffffff;
              }
            }
            else {
              if (xmlDebugCatalogs != 0) {
                pp_Var7 = __xmlGenericError();
                p_Var1 = *pp_Var7;
                ppvVar8 = __xmlGenericErrorContext();
                (*p_Var1)(*ppvVar8,"Using rewriting rule %s\n",local_1d8->name);
              }
              pxVar9 = xmlStrdup(local_1d8->URL);
              if (pxVar9 == (xmlChar *)0x0) goto LAB_0013ab60;
              pxVar9 = xmlStrcat(pxVar9,URI + uVar2);
            }
          }
          else {
            __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                            catal_01,(void *)0x0,0x14,0x676,XML_ERR_ERROR,(char *)0x0,0,
                            (char *)catal_01->name,(char *)0x0,(char *)0x0,0,0,
                            "Detected recursion in catalog %s\n",catal_01->name,0,0);
LAB_0013ab60:
            pxVar9 = (xmlChar *)0x0;
          }
LAB_0013adfb:
          if (pxVar9 != (xmlChar *)0x0) {
            return pxVar9;
          }
        }
      }
      catal = catal->next;
    } while (catal != (_xmlCatalogEntry *)0x0);
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlCatalogListXMLResolveURI(xmlCatalogEntryPtr catal, const xmlChar *URI) {
    xmlChar *ret = NULL;
    xmlChar *urnID = NULL;

    if (catal == NULL)
        return(NULL);
    if (URI == NULL)
	return(NULL);

    if (!xmlStrncmp(URI, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(URI);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlGenericError(xmlGenericErrorContext,
			"URN ID %s expanded to NULL\n", URI);
	    else
		xmlGenericError(xmlGenericErrorContext,
			"URN ID expanded to %s\n", urnID);
	}
	ret = xmlCatalogListXMLResolve(catal, urnID, NULL);
	if (urnID != NULL)
	    xmlFree(urnID);
	return(ret);
    }
    while (catal != NULL) {
	if (catal->type == XML_CATA_CATALOG) {
	    if (catal->children == NULL) {
		xmlFetchXMLCatalogFile(catal);
	    }
	    if (catal->children != NULL) {
		ret = xmlCatalogXMLResolveURI(catal->children, URI);
		if (ret != NULL)
		    return(ret);
	    }
	}
	catal = catal->next;
    }
    return(ret);
}